

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

Client * __thiscall Server::Private::pair(Private *this,ICallback *callback,Socket *otherSocket)

{
  bool bVar1;
  ClientImpl *this_00;
  int size;
  Socket socket;
  Socket *pSVar2;
  
  Socket::Socket(&socket);
  pSVar2 = otherSocket;
  bVar1 = Socket::pair(&socket,otherSocket);
  size = (int)pSVar2;
  if (bVar1) {
    bVar1 = Socket::setNonBlocking(&socket);
    if (bVar1) {
      if (this->_keepAlive == true) {
        bVar1 = Socket::setKeepAlive(&socket);
        if (!bVar1) goto LAB_00112f93;
      }
      if (this->_noDelay == true) {
        bVar1 = Socket::setNoDelay(&socket);
        if (!bVar1) goto LAB_00112f93;
      }
      size = this->_sendBufferSize;
      if (0 < size) {
        bVar1 = Socket::setSendBufferSize(&socket,size);
        if (!bVar1) goto LAB_00112f93;
      }
      size = this->_receiveBufferSize;
      if (0 < size) {
        bVar1 = Socket::setReceiveBufferSize(&socket,size);
        if (!bVar1) goto LAB_00112f93;
      }
      this_00 = PoolList<Server::Private::ClientImpl>::append<Server::Private&>
                          (&this->_clients,this);
      this_00->_callback = callback;
      Socket::swap(&this_00->super_Socket,&socket);
      Socket::Poll::set(&this->_sockets,&this_00->super_Socket,1);
      goto LAB_00112f9e;
    }
  }
LAB_00112f93:
  Socket::close(otherSocket,size);
  this_00 = (ClientImpl *)0x0;
LAB_00112f9e:
  Socket::~Socket(&socket);
  return (Client *)this_00;
}

Assistant:

Server::Client *Server::Private::pair(Client::ICallback &callback, Socket &otherSocket)
{
  Socket socket;
  if (!socket.pair(otherSocket) ||
      !socket.setNonBlocking() ||
      (_keepAlive && !socket.setKeepAlive()) ||
      (_noDelay && !socket.setNoDelay()) ||
      (_sendBufferSize > 0 && !socket.setSendBufferSize(_sendBufferSize)) ||
      (_receiveBufferSize > 0 && !socket.setReceiveBufferSize(_receiveBufferSize)))
  {
    otherSocket.close();
    return 0;
  }
  ClientImpl &client = _clients.append<Server::Private &>(*this);
  client._callback = &callback;
  client.swap(socket);
  _sockets.set(client, Socket::Poll::readFlag);
  return (Server::Client *)&client;
}